

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equationofstateCmd.cpp
# Opt level: O0

int getopt_internal_r(int argc,char **argv,char *optstring,option *longopts,int *longind,
                     custom_getopt_data *d)

{
  long in_RCX;
  char *in_RDX;
  int *in_RSI;
  int in_EDI;
  char **in_R8;
  custom_getopt_data *in_R9;
  char *unaff_retaddr;
  char **in_stack_00000008;
  int print_errors;
  int ret;
  custom_getopt_data *in_stack_ffffffffffffffc0;
  int iVar1;
  int in_stack_ffffffffffffffcc;
  int print_errors_00;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = in_R9->custom_opterr;
  if (*in_RDX == ':') {
    iVar1 = 0;
  }
  if (in_EDI < 1) {
    iVar1 = -1;
  }
  else {
    in_R9->custom_optarg = (char *)0x0;
    if ((in_R9->custom_optind == 0) || (in_R9->initialized == 0)) {
      if (in_R9->custom_optind == 0) {
        in_R9->custom_optind = 1;
      }
      custom_getopt_initialize(in_R9);
    }
    print_errors_00 = (int)((ulong)in_RDX >> 0x20);
    if ((in_R9->nextchar == (char *)0x0) || (*in_R9->nextchar == '\0')) {
      iVar1 = shuffle_argv((int)in_RCX,in_R8,(option *)in_R9,
                           (custom_getopt_data *)CONCAT44(in_stack_ffffffffffffffcc,iVar1));
      if (iVar1 != 0) {
        return iVar1;
      }
      in_stack_ffffffffffffffcc = 0;
    }
    if ((in_RCX == 0) || (*(char *)(*(long *)(in_RSI + (long)in_R9->custom_optind * 2) + 1) != '-'))
    {
      iVar1 = check_short_opt((int)in_RCX,in_R8,(char *)in_R9,in_stack_ffffffffffffffcc,
                              in_stack_ffffffffffffffc0);
    }
    else {
      iVar1 = check_long_opt(print_errors,in_stack_00000008,unaff_retaddr,
                             (option *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),in_RSI,
                             print_errors_00,(custom_getopt_data *)longind);
    }
  }
  return iVar1;
}

Assistant:

static int getopt_internal_r(int argc, char *const *argv, const char *optstring,
		const struct option *longopts, int *longind,
		struct custom_getopt_data *d)
{
	int ret, print_errors = d->custom_opterr;

	if (optstring[0] == ':')
		print_errors = 0;
	if (argc < 1)
		return -1;
	d->custom_optarg = NULL;

	/* 
	 * This is a big difference with GNU getopt, since optind == 0
	 * means initialization while here 1 means first call.
	 */
	if (d->custom_optind == 0 || !d->initialized) {
		if (d->custom_optind == 0)
			d->custom_optind = 1;	/* Don't scan ARGV[0], the program name.  */
		custom_getopt_initialize(d);
	}
	if (d->nextchar == NULL || *d->nextchar == '\0') {
		ret = shuffle_argv(argc, argv, longopts, d);
		if (ret)
			return ret;
	}
	if (longopts && (argv[d->custom_optind][1] == '-' ))
		return check_long_opt(argc, argv, optstring, longopts,
			longind, print_errors, d);
	return check_short_opt(argc, argv, optstring, print_errors, d);
}